

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,Select *pSelect)

{
  sqlite3 *db_00;
  Table *p_00;
  ExprList *pEVar1;
  Schema *pSVar2;
  int iVar3;
  int iVar4;
  Vdbe *p_01;
  Table *pTable;
  void *pvVar5;
  char *pcVar6;
  int nName;
  char *zName;
  Schema *pSchema;
  Table *pOld;
  Db *pDb;
  Table *pSelTab;
  SelectDest dest;
  char *zStmt;
  char *zType2;
  char *zType;
  Vdbe *v;
  int n;
  int i;
  ExprList *pList;
  NameContext sNC;
  SrcList sSrc;
  int iDb;
  sqlite3 *db;
  Table *p;
  Select *pSelect_local;
  Token *pEnd_local;
  Token *pCons_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((((pEnd != (Token *)0x0) || (pSelect != (Select *)0x0)) && (db_00->mallocFailed == '\0')) &&
     (p_00 = pParse->pNewTable, p_00 != (Table *)0x0)) {
    iVar3 = sqlite3SchemaToIndex(db_00,p_00->pSchema);
    if (p_00->pCheck != (ExprList *)0x0) {
      memset(&pList,0,0x38);
      memset(&sNC.ncFlags,0,0x70);
      sNC.ncFlags = '\x01';
      sNC._49_1_ = 0;
      sNC.pParse = (Parse *)&sNC.ncFlags;
      sNC.nRef._0_1_ = 4;
      pEVar1 = p_00->pCheck;
      pList = (ExprList *)pParse;
      for (v._4_4_ = 0; v._4_4_ < pEVar1->nExpr; v._4_4_ = v._4_4_ + 1) {
        iVar4 = sqlite3ResolveExprNames((NameContext *)&pList,pEVar1->a[v._4_4_].pExpr);
        if (iVar4 != 0) {
          return;
        }
      }
    }
    if ((db_00->init).busy != '\0') {
      p_00->tnum = (db_00->init).newTnum;
    }
    if ((db_00->init).busy == '\0') {
      p_01 = sqlite3GetVdbe(pParse);
      if (p_01 == (Vdbe *)0x0) {
        return;
      }
      sqlite3VdbeAddOp1(p_01,0x2d,0);
      if (p_00->pSelect == (Select *)0x0) {
        zType2 = "table";
        zStmt = "TABLE";
      }
      else {
        zType2 = "view";
        zStmt = "VIEW";
      }
      if (pSelect != (Select *)0x0) {
        sqlite3VdbeAddOp3(p_01,0x28,1,pParse->regRoot,iVar3);
        sqlite3VdbeChangeP5(p_01,'\x02');
        pParse->nTab = 2;
        sqlite3SelectDestInit((SelectDest *)&pSelTab,8,1);
        sqlite3Select(pParse,pSelect,(SelectDest *)&pSelTab);
        sqlite3VdbeAddOp1(p_01,0x2d,1);
        if (pParse->nErr == 0) {
          pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
          if (pTable == (Table *)0x0) {
            return;
          }
          p_00->nCol = pTable->nCol;
          p_00->aCol = pTable->aCol;
          pTable->nCol = 0;
          pTable->aCol = (Column *)0x0;
          sqlite3DeleteTable(db_00,pTable);
        }
      }
      if (pSelect == (Select *)0x0) {
        dest._8_8_ = sqlite3MPrintf(db_00,"CREATE %s %.*s",zStmt,
                                    (ulong)(((int)pEnd->z - (int)(pParse->sNameToken).z) + 1),
                                    (pParse->sNameToken).z);
      }
      else {
        dest._8_8_ = createTableStmt(db_00,p_00);
      }
      pcVar6 = "sqlite_master";
      if (iVar3 == 1) {
        pcVar6 = "sqlite_temp_master";
      }
      sqlite3NestedParse(pParse,
                         "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                         ,db_00->aDb[iVar3].zName,pcVar6,zType2,p_00->zName,p_00->zName,
                         pParse->regRoot,dest._8_8_,pParse->regRowid);
      sqlite3DbFree(db_00,(void *)dest._8_8_);
      sqlite3ChangeCookie(pParse,iVar3);
      if (((p_00->tabFlags & 8) != 0) && ((db_00->aDb[iVar3].pSchema)->pSeqTab == (Table *)0x0)) {
        sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",
                           db_00->aDb[iVar3].zName);
      }
      pcVar6 = sqlite3MPrintf(db_00,"tbl_name=\'%q\'",p_00->zName);
      sqlite3VdbeAddParseSchemaOp(p_01,iVar3,pcVar6);
    }
    if ((db_00->init).busy != '\0') {
      pSVar2 = p_00->pSchema;
      pcVar6 = p_00->zName;
      iVar3 = sqlite3Strlen30(p_00->zName);
      pvVar5 = sqlite3HashInsert(&pSVar2->tblHash,pcVar6,iVar3,p_00);
      if (pvVar5 == (void *)0x0) {
        pParse->pNewTable = (Table *)0x0;
        db_00->flags = db_00->flags | 2;
        if (p_00->pSelect == (Select *)0x0) {
          pcVar6 = (pParse->sNameToken).z;
          pEnd_local = pCons;
          if (pCons->z == (char *)0x0) {
            pEnd_local = pEnd;
          }
          iVar3 = sqlite3Utf8CharLen(pcVar6,(int)pEnd_local->z - (int)pcVar6);
          p_00->addColOffset = iVar3 + 0xd;
        }
      }
      else {
        db_00->mallocFailed = '\x01';
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The final ')' token in the CREATE TABLE */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;
  sqlite3 *db = pParse->db;
  int iDb;

  if( (pEnd==0 && pSelect==0) || db->mallocFailed ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
    NameContext sNC;                /* Name context for pParse->pNewTable */
    ExprList *pList;                /* List of all CHECK constraints */
    int i;                          /* Loop counter */

    memset(&sNC, 0, sizeof(sNC));
    memset(&sSrc, 0, sizeof(sSrc));
    sSrc.nSrc = 1;
    sSrc.a[0].zName = p->zName;
    sSrc.a[0].pTab = p;
    sSrc.a[0].iCursor = -1;
    sNC.pParse = pParse;
    sNC.pSrcList = &sSrc;
    sNC.ncFlags = NC_IsCheck;
    pList = p->pCheck;
    for(i=0; i<pList->nExpr; i++){
      if( sqlite3ResolveExprNames(&sNC, pList->a[i].pExpr) ){
        return;
      }
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;
      Table *pSelTab;

      assert(pParse->nTab==1);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      sqlite3SelectDestInit(&dest, SRT_Table, 1);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
      if( pParse->nErr==0 ){
        pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
        if( pSelTab==0 ) return;
        assert( p->aCol==0 );
        p->nCol = pSelTab->nCol;
        p->aCol = pSelTab->aCol;
        pSelTab->nCol = 0;
        pSelTab->aCol = 0;
        sqlite3DeleteTable(db, pSelTab);
      }
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      n = (int)(pEnd->z - pParse->sNameToken.z) + 1;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( p->tabFlags & TF_Autoincrement ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
               sqlite3MPrintf(db, "tbl_name='%q'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName,
                             sqlite3Strlen30(p->zName),p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      db->mallocFailed = 1;
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}